

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O3

vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> * __thiscall
TestRunner::getTestsList
          (vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
           *__return_storage_ptr__,TestRunner *this,path *dir)

{
  size_type sVar1;
  bool bVar2;
  directory_entry *this_00;
  path *this_01;
  long *plVar3;
  size_type *psVar4;
  path *test;
  _Alloc_hider __args;
  directory_iterator __end1;
  directory_iterator __begin1;
  path fileName;
  string_type local_118;
  directory_iterator local_f8;
  TestRunner *local_e8;
  directory_iterator local_e0;
  string local_d0;
  directory_iterator local_b0;
  path local_a0;
  path local_80;
  directory_iterator local_60;
  path local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = this;
  ghc::filesystem::directory_iterator::directory_iterator(&local_f8,dir);
  ghc::filesystem::directory_iterator::directory_iterator(&local_60,&local_f8);
  ghc::filesystem::begin(&local_60);
  ghc::filesystem::directory_iterator::~directory_iterator(&local_60);
  ghc::filesystem::end(&local_e0);
  while( true ) {
    bVar2 = ghc::filesystem::directory_iterator::operator!=(&local_b0,&local_e0);
    if (!bVar2) break;
    this_00 = ghc::filesystem::directory_iterator::operator*(&local_b0);
    bVar2 = ghc::filesystem::directory_entry::is_directory(this_00);
    if (bVar2) {
      this_01 = ghc::filesystem::directory_entry::path(this_00);
      ghc::filesystem::path::filename(&local_50,this_01);
      ghc::filesystem::path::u8string_abi_cxx11_(&local_d0,&local_50);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_118.field_2._M_allocated_capacity = *psVar4;
        local_118.field_2._8_8_ = plVar3[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar4;
        local_118._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_118._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      ghc::filesystem::path::path(&local_a0,&local_118,auto_format);
      ghc::filesystem::operator/(&local_80,this_01,&local_a0);
      ghc::filesystem::path::~path(&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      ghc::filesystem::path::~path(&local_50);
      bVar2 = ghc::filesystem::exists(&local_80);
      if (bVar2) {
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::push_back
                  (__return_storage_ptr__,this_01);
      }
      else {
        getTestsList((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                     &local_a0,local_e8,this_01);
        sVar1 = local_a0._path._M_string_length;
        for (__args._M_p = local_a0._path._M_dataplus._M_p; __args._M_p != (pointer)sVar1;
            __args._M_p = __args._M_p + 0x20) {
          std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::
          emplace_back<ghc::filesystem::path>(__return_storage_ptr__,(path *)__args._M_p);
        }
        std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector
                  ((vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> *)
                   &local_a0);
      }
      ghc::filesystem::path::~path(&local_80);
    }
    ghc::filesystem::directory_iterator::operator++(&local_b0);
  }
  ghc::filesystem::directory_iterator::~directory_iterator(&local_e0);
  ghc::filesystem::directory_iterator::~directory_iterator(&local_b0);
  ghc::filesystem::directory_iterator::~directory_iterator(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<fs::path> TestRunner::getTestsList(const fs::path& dir)
{
	std::vector<fs::path> tests;

	for(auto &entry : fs::directory_iterator(dir))
	{
		if (!entry.is_directory())
			continue;

		const auto &path = entry.path();
		fs::path fileName = path / (path.filename().u8string() + ".asm");

		if (fs::exists(fileName))
		{
			tests.push_back(path);
		}
		else
		{
			for (auto &&test : getTestsList(path))
			{
				tests.emplace_back(std::move(test));
			}
		}
	}

	return tests;
}